

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::UnknownFieldLiteParserHelper::AddFixed32
          (UnknownFieldLiteParserHelper *this,uint32_t num,uint32_t value)

{
  uint8_t local_1c [4];
  uint32_t local_18;
  char buffer [4];
  uint32_t value_local;
  uint32_t num_local;
  UnknownFieldLiteParserHelper *this_local;
  
  if (this->unknown_ != (string *)0x0) {
    local_18 = value;
    buffer = (char  [4])num;
    WriteVarint((ulong)(num * 8 + 5),this->unknown_);
    io::CodedOutputStream::WriteLittleEndian32ToArray(local_18,local_1c);
    std::__cxx11::string::append((char *)this->unknown_,(ulong)local_1c);
  }
  return;
}

Assistant:

void AddFixed32(uint32_t num, uint32_t value) {
    if (unknown_ == nullptr) return;
    WriteVarint(num * 8 + 5, unknown_);
    char buffer[4];
    io::CodedOutputStream::WriteLittleEndian32ToArray(
        value, reinterpret_cast<uint8_t*>(buffer));
    unknown_->append(buffer, 4);
  }